

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetPropertyOnTaggedNumber
               (Var receiver,RecyclableObject *object,PropertyId propertyId,Var newValue,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  SideEffects SVar3;
  InlineCacheFlags IVar4;
  PropertyIndex PVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *function;
  JavascriptProxy *this;
  ThreadContext *this_00;
  JavascriptProxy *proxy;
  RecyclableObject *func;
  undefined1 local_88 [4];
  DescriptorFlags flags;
  PropertyValueInfo info;
  Var setterValueOrProxy;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *requestContext_local;
  Var newValue_local;
  RecyclableObject *pRStack_20;
  PropertyId propertyId_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  pRStack_20 = object;
  object_local = (RecyclableObject *)receiver;
  bVar2 = TaggedNumber::Is(receiver);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xa3d,"(TaggedNumber::Is(receiver))","TaggedNumber::Is(receiver)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  SVar3 = ScriptContextOptimizationOverrideInfo::GetSideEffects
                    (&requestContext->optimizationOverrides);
  if ((SVar3 & SideEffects_Accessor) != SideEffects_None) {
    info.inlineCacheIndex = 0;
    info.isFunctionPIC = false;
    info.allowResizingPolymorphicInlineCache = false;
    info._62_2_ = 0;
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_88);
    func._4_4_ = 0;
    if (pRStack_20 == (RecyclableObject *)0x0) {
      GetPropertyObject(object_local,requestContext,&stack0xffffffffffffffe0);
    }
    BVar6 = CheckPrototypesForAccessorOrNonWritableProperty
                      (pRStack_20,propertyId,(Var *)&info.inlineCacheIndex,
                       (DescriptorFlags *)((long)&func + 4),(PropertyValueInfo *)local_88,
                       requestContext);
    if (BVar6 != 0) {
      if ((func._4_4_ & 1) == 1) {
        bVar2 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                          (propertyOperationFlags,(Var)info._56_8_,requestContext);
        if (bVar2) {
          return 1;
        }
        if (info._56_8_ != 0) {
          function = VarTo<Js::RecyclableObject>((Var)info._56_8_);
          IVar4 = PropertyValueInfo::GetFlags((PropertyValueInfo *)local_88);
          if ((IVar4 != InlineCacheSetterFlag) &&
             (PVar5 = PropertyValueInfo::GetPropertyIndex((PropertyValueInfo *)local_88),
             PVar5 != 0xffff)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xa53,
                                        "(info.GetFlags() == InlineCacheSetterFlag || info.GetPropertyIndex() == Constants::NoSlot)"
                                        ,
                                        "info.GetFlags() == InlineCacheSetterFlag || info.GetPropertyIndex() == Constants::NoSlot"
                                       );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          CallSetter(function,object_local,newValue,requestContext);
          return 1;
        }
      }
      else {
        if ((func._4_4_ & 0x10) == 0x10) {
          bVar2 = VarIs<Js::JavascriptProxy>((Var)info._56_8_);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xa5a,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                        "VarIs<JavascriptProxy>(setterValueOrProxy)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          this = VarTo<Js::JavascriptProxy>((Var)info._56_8_);
          BVar6 = Js::JavascriptProxy::SetPropertyTrap
                            (this,object_local,SetPropertyOnTaggedNumberKind,propertyId,newValue,
                             requestContext,propertyOperationFlags,0);
          return BVar6;
        }
        if (((func._4_4_ & 2) != 2) || ((func._4_4_ & 4) != 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0xa60,
                                      "((flags & Data) == Data && (flags & Writable) == None)",
                                      "(flags & Data) == Data && (flags & Writable) == None");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
      }
    }
  }
  this_00 = ScriptContext::GetThreadContext(requestContext);
  ThreadContext::AddImplicitCallFlags(this_00,ImplicitCall_NoOpSet);
  JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetPropertyOnTaggedNumber(Var receiver, RecyclableObject* object, PropertyId propertyId, Var newValue, ScriptContext* requestContext,
        PropertyOperationFlags propertyOperationFlags)
    {
        Assert (TaggedNumber::Is(receiver));

        if (requestContext->optimizationOverrides.GetSideEffects() & SideEffects_Accessor)
        {
            Var setterValueOrProxy = nullptr;
            PropertyValueInfo info;
            DescriptorFlags flags = None;
            if (object == nullptr)
            {
                GetPropertyObject(receiver, requestContext, &object);
            }
            if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableProperty(object, propertyId, &setterValueOrProxy, &flags, &info, requestContext))
            {
                if ((flags & Accessor) == Accessor)
                {
                    if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext))
                    {
                        return TRUE;
                    }
                    if (setterValueOrProxy)
                    {
                        RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                        Assert(info.GetFlags() == InlineCacheSetterFlag || info.GetPropertyIndex() == Constants::NoSlot);
                        JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                        return TRUE;
                    }
                }
                else if ((flags & Proxy) == Proxy)
                {
                    Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                    JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                    return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetPropertyOnTaggedNumberKind, propertyId, newValue, requestContext, propertyOperationFlags);
                }
                else
                {
                    Assert((flags & Data) == Data && (flags & Writable) == None);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                }
            }
        }

        // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
        requestContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
        return FALSE;
    }